

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulator.c
# Opt level: O2

_Bool al_triangulate_polygon
                (float *vertices,size_t vertex_stride,int *vertex_counts,
                _func_void_int_int_int_void_ptr *emit_triangle,void *userdata)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  _Bool _Var4;
  char cVar5;
  uint *__ptr;
  ulong uVar6;
  _AL_LIST *vertices_00;
  _AL_LIST *reflex;
  _AL_LIST *ear;
  _AL_LIST *p_Var7;
  long lVar8;
  int *piVar9;
  _AL_LIST_ITEM *p_Var10;
  _AL_LIST_ITEM *p_Var11;
  ulong uVar12;
  float *pfVar13;
  float *p1;
  float *pfVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  _AL_LIST *reflex_00;
  long lVar20;
  float *v0;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  _AL_LIST_ITEM *local_e0;
  _AL_LIST_ITEM *local_98;
  float t1;
  float t0;
  float v1 [2];
  float local_78 [2];
  float local_40;
  float fStack_3c;
  float intersection [2];
  
  uVar19 = 0xffffffffffffffff;
  lVar20 = 4;
  lVar21 = -0x20;
  lVar22 = lVar20;
  do {
    lVar20 = lVar20 + -4;
    lVar22 = lVar22 + -2;
    lVar21 = lVar21 + 0x20;
    lVar8 = uVar19 + 1;
    uVar19 = uVar19 + 1;
  } while (0 < vertex_counts[lVar8]);
  __ptr = (uint *)malloc(-lVar20);
  uVar18 = 0;
  if (__ptr != (uint *)0x0) {
    for (uVar6 = 0; uVar19 != uVar6; uVar6 = uVar6 + 1) {
      uVar18 = uVar18 + vertex_counts[uVar6];
      __ptr[uVar6] = uVar18;
    }
    lVar22 = (int)uVar18 - lVar22;
    vertices_00 = (_AL_LIST *)_al_list_create_static(lVar22);
    reflex = (_AL_LIST *)_al_list_create_static(lVar22);
    ear = (_AL_LIST *)_al_list_create_static(lVar22);
    if (uVar19 < 2) {
      p_Var7 = (_AL_LIST *)0x0;
    }
    else {
      p_Var7 = (_AL_LIST *)_al_list_create_static(uVar19);
      lVar20 = al_malloc_with_context
                         (lVar21,0x112,
                          "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/primitives/triangulator.c"
                          ,"poly_create_split_list");
      if (lVar20 == 0 || p_Var7 == (_AL_LIST *)0x0) {
        _al_list_destroy();
        al_free_with_context
                  (lVar20,0x117,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/primitives/triangulator.c"
                   ,"poly_create_split_list");
        p_Var7 = (_AL_LIST *)0x0;
      }
      else {
        _al_list_set_dtor(p_Var7,poly_split_list_dtor);
        _al_list_set_user_data(p_Var7,lVar20);
        uVar18 = *__ptr;
        for (uVar6 = 1; uVar19 != uVar6; uVar6 = uVar6 + 1) {
          lVar22 = uVar6 * 0x20;
          lVar21 = lVar20 + lVar22;
          *(uint *)(lVar20 + lVar22) = uVar18;
          uVar2 = __ptr[uVar6];
          *(long *)(lVar20 + 8 + lVar22) = (long)(int)(uVar2 - uVar18);
          uVar17 = (ulong)(int)uVar18;
          pfVar14 = (float *)(vertex_stride * uVar17 + (long)vertices);
          uVar12 = 0xffffffffffffffff;
          fVar26 = -3.4028235e+38;
          for (; (long)uVar17 < (long)(int)uVar2; uVar17 = uVar17 + 1) {
            fVar1 = *pfVar14;
            if (fVar26 <= fVar1) {
              *(float **)(lVar21 + 0x10) = pfVar14;
              *(int *)(lVar21 + 0x18) = (int)uVar17;
              uVar12 = uVar17 & 0xffffffff;
              fVar26 = fVar1;
            }
            pfVar14 = (float *)((long)pfVar14 + vertex_stride);
          }
          *(uint *)(lVar21 + 0x18) = (int)uVar12 - uVar18;
          cVar5 = _al_list_is_empty(p_Var7);
          if (cVar5 == '\0') {
            for (lVar22 = _al_list_front(p_Var7); lVar22 != 0; lVar22 = _al_list_next(p_Var7,lVar22)
                ) {
              lVar8 = _al_list_item_data(lVar22);
              if (**(float **)(lVar8 + 0x10) <= fVar26 && fVar26 != **(float **)(lVar8 + 0x10)) {
                _al_list_insert_before(p_Var7,lVar22,lVar21);
                goto LAB_0010d2b2;
              }
            }
          }
          _al_list_push_back(p_Var7,lVar21);
LAB_0010d2b2:
          uVar18 = uVar2;
        }
      }
    }
    bVar24 = ear != (_AL_LIST *)0x0;
    if ((p_Var7 != (_AL_LIST *)0x0 || uVar19 < 2) &&
        (bVar24 && (reflex != (_AL_LIST *)0x0 && vertices_00 != (_AL_LIST *)0x0))) {
      uVar6 = 0;
      pfVar14 = vertices;
      if (0 < (int)*__ptr) {
        uVar6 = (ulong)*__ptr;
      }
      while (bVar23 = uVar6 != 0, uVar6 = uVar6 - 1, bVar23) {
        _al_list_push_back(vertices_00,pfVar14);
        pfVar14 = (float *)((long)pfVar14 + vertex_stride);
      }
      reflex_00 = reflex;
      if (1 < uVar19) {
        poly_classify_vertices(vertices_00,reflex,(_AL_LIST *)0x0);
        lVar20 = _al_list_front(p_Var7);
        while (lVar20 != 0) {
          piVar9 = (int *)_al_list_item_data(lVar20);
          pfVar14 = *(float **)(piVar9 + 4);
          v1[0] = *pfVar14 + 1.0;
          v1[1] = pfVar14[1];
          p_Var10 = (_AL_LIST_ITEM *)_al_list_front(vertices_00);
          local_78[0] = 0.0;
          local_78[1] = 0.0;
          fVar26 = 3.4028235e+38;
          local_e0 = (_AL_LIST_ITEM *)0x0;
          local_98 = (_AL_LIST_ITEM *)0x0;
          uVar6 = 0;
          while( true ) {
            p_Var11 = (_AL_LIST_ITEM *)_al_list_next_circular(vertices_00);
            uVar12 = _al_list_size(vertices_00);
            if (uVar12 <= uVar6) break;
            pfVar13 = (float *)_al_list_item_data(p_Var10);
            p1 = (float *)_al_list_item_data(p_Var11);
            if ((((p1[1] < pfVar13[1] || p1[1] == pfVar13[1]) &&
                 (((*pfVar14 < *pfVar13 || (*pfVar14 < *p1)) &&
                  (_Var4 = _al_prim_intersect_segment(pfVar14,v1,pfVar13,p1,intersection,&t0,&t1),
                  _Var4)))) && (((0.0 <= t1 && (t1 <= 1.0)) && (0.0 <= t0)))) && (t0 < fVar26)) {
              local_78[0] = intersection[0];
              local_78[1] = intersection[1];
              local_e0 = p_Var10;
              local_98 = p_Var11;
              fVar26 = t0;
            }
            uVar6 = uVar6 + 1;
            p_Var10 = p_Var11;
          }
          if (local_e0 == (_AL_LIST_ITEM *)0x0) break;
          local_40 = local_78[0];
          fStack_3c = local_78[1];
          pfVar13 = (float *)_al_list_item_data();
          pfVar14 = (float *)_al_list_item_data(local_98);
          _Var4 = _al_prim_are_points_equal(*(float **)(piVar9 + 4),pfVar13);
          if (!_Var4) {
            _Var4 = _al_prim_are_points_equal(*(float **)(piVar9 + 4),pfVar14);
            p_Var10 = local_98;
            if (!_Var4) {
              fVar26 = *pfVar13;
              fVar1 = *pfVar14;
              if (fVar1 < fVar26) {
                pfVar14 = pfVar13;
              }
              lVar20 = _al_list_front(reflex);
              fVar3 = 3.4028235e+38;
              p_Var11 = (_AL_LIST_ITEM *)0x0;
              while (lVar20 != 0) {
                p_Var10 = (_AL_LIST_ITEM *)_al_list_item_data(lVar20);
                pfVar13 = (float *)_al_list_item_data(p_Var10);
                _Var4 = _al_prim_is_point_in_triangle
                                  (pfVar13,*(float **)(piVar9 + 4),pfVar14,&local_40);
                if ((_Var4) &&
                   (fVar25 = *pfVar13 - **(float **)(piVar9 + 4),
                   fVar27 = pfVar13[1] - (*(float **)(piVar9 + 4))[1],
                   fVar25 = fVar25 * fVar25 + fVar27 * fVar27, fVar25 < fVar3)) {
                  p_Var11 = p_Var10;
                  fVar3 = fVar25;
                }
                lVar20 = _al_list_next(reflex);
              }
              if (fVar1 < fVar26) {
                local_98 = local_e0;
              }
              p_Var10 = local_98;
              if (p_Var11 != (_AL_LIST_ITEM *)0x0) {
                p_Var10 = p_Var11;
              }
            }
            local_e0 = p_Var10;
            if (local_e0 == (_AL_LIST_ITEM *)0x0) break;
          }
          p_Var10 = local_e0;
          for (uVar6 = 0; uVar6 <= *(ulong *)(piVar9 + 2); uVar6 = uVar6 + 1) {
            p_Var10 = (_AL_LIST_ITEM *)
                      _al_list_insert_after
                                (vertices_00,p_Var10,
                                 (float *)((((long)piVar9[6] + uVar6) % *(ulong *)(piVar9 + 2) +
                                           (long)*piVar9) * vertex_stride + (long)vertices));
          }
          uVar15 = _al_list_item_data(local_e0);
          uVar15 = _al_list_insert_after(vertices_00,p_Var10,uVar15);
          _al_list_remove(reflex,local_e0);
          p_Var10 = (_AL_LIST_ITEM *)_al_list_next(vertices_00,uVar15);
          poly_classify_vertices_in_range(local_e0,p_Var10,vertices_00,reflex,(_AL_LIST *)0x0);
          lVar20 = _al_list_next(p_Var7);
        }
        _al_list_destroy(p_Var7);
        reflex_00 = (_AL_LIST *)0x0;
      }
      poly_classify_vertices(vertices_00,reflex_00,ear);
      while (cVar5 = _al_list_is_empty(ear), cVar5 == '\0') {
        uVar15 = _al_list_front(ear);
        uVar16 = _al_list_item_data(uVar15);
        p_Var10 = (_AL_LIST_ITEM *)_al_list_previous_circular(vertices_00,uVar16);
        p_Var11 = (_AL_LIST_ITEM *)_al_list_next_circular(vertices_00,uVar16);
        lVar20 = _al_list_item_data(p_Var10);
        lVar21 = _al_list_item_data(uVar16);
        lVar22 = _al_list_item_data(p_Var11);
        (*emit_triangle)((int)((ulong)(lVar20 - (long)vertices) / vertex_stride),
                         (int)((ulong)(lVar21 - (long)vertices) / vertex_stride),
                         (int)((ulong)(lVar22 - (long)vertices) / vertex_stride),userdata);
        _al_list_erase(ear,uVar15);
        _al_list_erase(vertices_00,uVar16);
        uVar15 = _al_list_find_first(reflex,uVar16);
        _al_list_erase(reflex,uVar15);
        poly_update_vertex_attributes(vertices_00,reflex,ear,p_Var10);
        poly_update_vertex_attributes(vertices_00,reflex,ear,p_Var11);
      }
      _al_list_destroy(vertices_00);
      _al_list_destroy(reflex);
    }
    else {
      _al_list_destroy(vertices_00);
      _al_list_destroy(reflex);
      _al_list_destroy(ear);
      ear = p_Var7;
    }
    _al_list_destroy(ear);
    uVar18 = (uint)((p_Var7 != (_AL_LIST *)0x0 || uVar19 < 2) &&
                   (bVar24 && (reflex != (_AL_LIST *)0x0 && vertices_00 != (_AL_LIST *)0x0)));
    free(__ptr);
  }
  return SUB41(uVar18,0);
}

Assistant:

bool al_triangulate_polygon(
   const float* vertices, size_t vertex_stride, const int* vertex_counts,
   void (*emit_triangle)(int, int, int, void*), void* userdata)
{
   POLY polygon;
   int vertex_count;
   int split_count;
   int *splits;
   int i;
   bool ret;

   for (i = 0; vertex_counts[i] > 0; i++) {
      /* do nothing */
   }
   ASSERT(i > 0);
   split_count = i;

   splits = malloc(split_count * sizeof(int));
   if (!splits) {
      return false;
   }
   vertex_count = 0;
   for (i = 0; i < split_count; i++) {
      vertex_count += vertex_counts[i];
      splits[i] = vertex_count;
   }

   memset(&polygon, 0, sizeof(polygon));
   polygon.vertex_buffer = vertices;
   polygon.vertex_stride = vertex_stride;
   polygon.vertex_count  = vertex_count;
   polygon.split_indices = splits;
   polygon.split_stride  = sizeof(int);   /* XXX can simplify code now */
   polygon.split_count   = split_count;
   polygon.emit          = emit_triangle;
   polygon.userdata      = userdata;

   if (poly_initialize(&polygon)) {

      poly_do_triangulate(&polygon);

      _al_list_destroy(polygon.vertex_list);
      _al_list_destroy(polygon.reflex_list);
      _al_list_destroy(polygon.ear_list);

      ret = true;
   }
   else {
      ret = false;
   }

   free(splits);

   return ret;
}